

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_operations.hpp
# Opt level: O2

rt_expression_interface<double> *
viennamath::simplify_impl<viennamath::rt_expression_interface<double>,double>
          (long *lhs,long *param_2)

{
  char cVar1;
  rt_expression_interface<double> *prVar2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  _func_int *p_Var6;
  
  cVar1 = (**(code **)(*lhs + 0x40))();
  if (cVar1 == '\0') {
    cVar1 = (**(code **)(*param_2 + 0x40))(param_2);
    if (cVar1 != '\0') {
      p_Var6 = (_func_int *)(**(code **)(*param_2 + 0x48))(param_2);
      if (((double)p_Var6 == 0.0) && (!NAN((double)p_Var6))) {
        prVar2 = (rt_expression_interface<double> *)(**(code **)(*lhs + 0x80))(lhs);
        return prVar2;
      }
      prVar2 = (rt_expression_interface<double> *)operator_new(0x20);
      pp_Var3 = (_func_int **)(**(code **)(*lhs + 0x80))(lhs);
      pp_Var4 = (_func_int **)operator_new(8);
      *pp_Var4 = (_func_int *)&PTR__op_interface_00117c98;
      pp_Var5 = (_func_int **)operator_new(0x10);
      *pp_Var5 = (_func_int *)&PTR__rt_expression_interface_001177a8;
      pp_Var5[1] = p_Var6;
      prVar2->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_binary_expr_00117498;
      prVar2[1]._vptr_rt_expression_interface = pp_Var3;
      prVar2[2]._vptr_rt_expression_interface = pp_Var4;
      goto LAB_001108cd;
    }
    prVar2 = (rt_expression_interface<double> *)operator_new(0x20);
    pp_Var3 = (_func_int **)(**(code **)(*lhs + 0x80))(lhs);
    pp_Var4 = (_func_int **)operator_new(8);
    *pp_Var4 = (_func_int *)&PTR__op_interface_00117c98;
    pp_Var5 = (_func_int **)(**(code **)(*param_2 + 0x80))(param_2);
  }
  else {
    p_Var6 = (_func_int *)(**(code **)(*lhs + 0x48))(lhs);
    prVar2 = (rt_expression_interface<double> *)operator_new(0x20);
    if (((double)p_Var6 != 0.0) || (NAN((double)p_Var6))) {
      pp_Var3 = (_func_int **)operator_new(0x10);
      *pp_Var3 = (_func_int *)&PTR__rt_expression_interface_001177a8;
      pp_Var3[1] = p_Var6;
      pp_Var4 = (_func_int **)operator_new(8);
      *pp_Var4 = (_func_int *)&PTR__op_interface_00117c98;
      pp_Var5 = (_func_int **)(**(code **)(*param_2 + 0x80))(param_2);
    }
    else {
      pp_Var3 = (_func_int **)operator_new(0x10);
      *pp_Var3 = (_func_int *)&PTR__rt_expression_interface_001177a8;
      pp_Var3[1] = (_func_int *)0xbff0000000000000;
      pp_Var4 = (_func_int **)operator_new(8);
      *pp_Var4 = (_func_int *)&PTR__op_interface_00117b28;
      pp_Var5 = (_func_int **)(**(code **)(*param_2 + 0x80))(param_2);
    }
  }
  prVar2->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_binary_expr_00117498;
  prVar2[1]._vptr_rt_expression_interface = pp_Var3;
  prVar2[2]._vptr_rt_expression_interface = pp_Var4;
LAB_001108cd:
  prVar2[3]._vptr_rt_expression_interface = pp_Var5;
  return prVar2;
}

Assistant:

InterfaceType * simplify_impl(const InterfaceType * lhs, op_minus<NumericT>, const InterfaceType * rhs)
  {
        if (lhs->is_constant())
        {
          NumericT val = lhs->unwrap();
          if (val == 0.0)
          {
            return new rt_binary_expr<InterfaceType>(new rt_constant<NumericT, InterfaceType>(-1),
                                                     new op_binary<op_mult<NumericT>, InterfaceType>(),
                                                     rhs->simplify());
          }

          return new rt_binary_expr<InterfaceType>(new rt_constant<NumericT, InterfaceType>(val),
                                                   new op_binary<op_minus<NumericT>, InterfaceType>(),
                                                   rhs->simplify());
        }
        else if (rhs->is_constant())
        {
          NumericT val = rhs->unwrap();
          if (val == 0.0)
            return lhs->simplify();

          return new rt_binary_expr<InterfaceType>(lhs->simplify(),
                                                   new op_binary<op_minus<NumericT>, InterfaceType>(),
                                                   new rt_constant<NumericT, InterfaceType>(val));
        }

        return new rt_binary_expr<InterfaceType>(lhs->simplify(),
                                                 new op_binary<op_minus<NumericT>, InterfaceType>(),
                                                 rhs->simplify());
  }